

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::StreamRedirect::~StreamRedirect(StreamRedirect *this)

{
  long *in_RDI;
  string local_28 [40];
  
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)in_RDI[0x31],local_28);
  std::__cxx11::string::~string(local_28);
  std::ios::rdbuf((streambuf *)(*in_RDI + *(long *)(*(long *)*in_RDI + -0x18)));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(in_RDI + 2));
  return;
}

Assistant:

~StreamRedirect() {
            m_targetString += m_oss.str();
            m_stream.rdbuf( m_prevBuf );
        }